

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O2

Msat_IntVec_t * Msat_IntVecAllocArray(int *pArray,int nSize)

{
  Msat_IntVec_t *pMVar1;
  
  pMVar1 = (Msat_IntVec_t *)malloc(0x10);
  pMVar1->nSize = nSize;
  pMVar1->nCap = nSize;
  pMVar1->pArray = pArray;
  return pMVar1;
}

Assistant:

Msat_IntVec_t * Msat_IntVecAllocArray( int * pArray, int nSize )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = pArray;
    return p;
}